

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

void __thiscall sjtu::UserManager::logout(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  pair<long,_bool> pVar7;
  long *local_60;
  long local_58;
  long local_50 [2];
  long local_40;
  undefined1 local_38;
  ulong local_30;
  
  this_00 = this->UserBpTree;
  pcVar1 = argv[1]._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + argv[1]._M_string_length);
  if (local_58 == 0) {
    local_30 = 0;
  }
  else {
    lVar6 = 0;
    lVar4 = 0;
    local_30 = 0;
    do {
      lVar4 = ((long)*(char *)((long)local_60 + lVar6) + lVar4 * 0x239 + 0x100) % 0x3b800001;
      local_30 = (long)((long)*(char *)((long)local_60 + lVar6) + local_30 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar6 = lVar6 + 1;
    } while (local_58 != lVar6);
    local_30 = lVar4 << 0x20 | local_30;
  }
  pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_30);
  local_40 = pVar7.first;
  local_38 = pVar7.second;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  iVar5 = -1;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    iVar2 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_40);
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (*(uint *)(lVar4 + 0x6c) == this->online_flag) {
      *(undefined4 *)(lVar4 + 0x6c) = 0;
      (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                (this->UserFile,lVar4 + 0x78);
      iVar5 = 0;
    }
  }
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void logout(int argc, std::string *argv) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(argv[1]));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (user->is_online == online_flag) {
                    user->is_online = 0;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;

        }